

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O0

void zpsoe::zlog::open_log_file(FILE **file)

{
  char *pcVar1;
  FILE *pFVar2;
  ostream *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string err_;
  size_t old_log_size_;
  FILE **file_local;
  
  err_.field_2._8_8_ = get_size_in_byte((string *)&DAT_0010f5c0);
  if ((ulong)err_.field_2._8_8_ < DAT_0010f5b8) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"ab+");
    *file = (FILE *)pFVar2;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"wb");
    *file = (FILE *)pFVar2;
  }
  if (*file == (FILE *)0x0) {
    std::operator+(&local_78,"cannot open \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DAT_0010f5c0);
    std::operator+(&local_58,&local_78,"\": ");
    errno_to_str_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_58,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this = std::operator<<((ostream *)&std::cerr,(string *)local_38);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return;
}

Assistant:

void open_log_file(FILE **file) {
  const size_t old_log_size_ = get_size_in_byte(G_LogConfig.path);

  if (old_log_size_ >= G_LogConfig.max_byte)
    // 覆盖
    *file = fopen(G_LogConfig.path.c_str(), "wb");
  else
    // 追加
    *file = fopen(G_LogConfig.path.c_str(), "ab+");

  if (*file == NULL) {
    const string err_("cannot open \"" + G_LogConfig.path + "\": " + errno_to_str());
    cerr << err_ << endl;
    exit(EXIT_FAILURE);
  }
}